

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

void freersapriv(RSAKey *key)

{
  if (key->private_exponent != (mp_int *)0x0) {
    mp_free(key->private_exponent);
    key->private_exponent = (mp_int *)0x0;
  }
  if (key->p != (mp_int *)0x0) {
    mp_free(key->p);
    key->p = (mp_int *)0x0;
  }
  if (key->q != (mp_int *)0x0) {
    mp_free(key->q);
    key->q = (mp_int *)0x0;
  }
  if (key->iqmp != (mp_int *)0x0) {
    mp_free(key->iqmp);
    key->iqmp = (mp_int *)0x0;
  }
  return;
}

Assistant:

void freersapriv(RSAKey *key)
{
    if (key->private_exponent) {
        mp_free(key->private_exponent);
        key->private_exponent = NULL;
    }
    if (key->p) {
        mp_free(key->p);
        key->p = NULL;
    }
    if (key->q) {
        mp_free(key->q);
        key->q = NULL;
    }
    if (key->iqmp) {
        mp_free(key->iqmp);
        key->iqmp = NULL;
    }
}